

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsSlicingUnbounded(void)

{
  reference piVar1;
  ostream *poVar2;
  int iVar3;
  Span<int,_18446744073709551615UL> SVar4;
  initializer_list<int> __l;
  Span<int,_18446744073709551615UL> span;
  Span<int,_18446744073709551615UL> sub;
  vector<int,_std::allocator<int>_> values;
  Span<int,_18446744073709551615UL> local_48;
  Span<int,_18446744073709551615UL> local_38;
  vector<int,_std::allocator<int>_> local_28;
  
  local_48.m_ptr = (pointer)0x200000001;
  local_48.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_28,__l,(allocator_type *)&local_38);
  local_48.m_ptr = (pointer)0x0;
  if ((long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_48.m_ptr =
         local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_48.m_size.m_size =
       (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_38 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_48,2);
  if (local_38.m_size.m_size.m_size == 2) {
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_38,0);
    if (*piVar1 == 3) {
      piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_38,1);
      if (*piVar1 == 4) {
        SVar4 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_48,0);
        if (SVar4.m_size.m_size.m_size == local_48.m_size.m_size) {
          if (SVar4.m_ptr == local_48.m_ptr) {
            iVar3 = 0;
            goto LAB_001bf365;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                     ,0x71);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1d6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,"(sub.Data()) == (span.Data())",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                     ,0x71);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1d5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,"(sub.Size()) == (span.Size())",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        }
        std::ostream::put((char)poVar2);
        iVar3 = 1;
        std::ostream::flush();
        goto LAB_001bf365;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub[1]) == (4)",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1cf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub[0]) == (3)",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1ce);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub.Size()) == (size_t(2))",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar3 = 1;
LAB_001bf365:
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int testSpanTestsSlicingUnbounded()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    {
        auto sub = span.Slice(2);
        ML_ASSERT_EQ(sub.Size(), size_t(2));
        ML_ASSERT_EQ(sub[0], 3);
        ML_ASSERT_EQ(sub[1], 4);
    }

    {
        auto sub = span.Slice(0);
        ML_ASSERT_EQ(sub.Size(), span.Size());
        ML_ASSERT_EQ(sub.Data(), span.Data());
    }

    return 0;
}